

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O2

void vkt::Draw::MemoryOp::pack
               (int pixelSize,int width,int height,int depth,VkDeviceSize rowPitchOrZero,
               VkDeviceSize depthPitchOrZero,void *srcBuffer,void *destBuffer)

{
  ulong uVar1;
  VkDeviceSize VVar2;
  void *__dest;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar7;
  void *__src;
  ulong uVar6;
  
  sVar3 = (size_t)(pixelSize * width);
  if (rowPitchOrZero == 0) {
    rowPitchOrZero = sVar3;
  }
  VVar2 = (long)height * rowPitchOrZero;
  if (depthPitchOrZero == 0) {
    depthPitchOrZero = VVar2;
  }
  if (depthPitchOrZero != VVar2 || rowPitchOrZero != sVar3) {
    uVar7 = 0;
    uVar5 = (ulong)(uint)height;
    if (height < 1) {
      uVar5 = uVar7;
    }
    uVar1 = (ulong)(uint)depth;
    if (depth < 1) {
      uVar1 = uVar7;
    }
    for (; uVar7 != uVar1; uVar7 = uVar7 + 1) {
      __src = (void *)((long)(pixelSize * width * height * (int)uVar7) + (long)srcBuffer);
      __dest = (void *)(depthPitchOrZero * uVar7 + (long)destBuffer);
      uVar6 = uVar5;
      while (iVar4 = (int)uVar6, uVar6 = (ulong)(iVar4 - 1), iVar4 != 0) {
        memcpy(__dest,__src,rowPitchOrZero);
        __src = (void *)((long)__src + sVar3);
        __dest = (void *)((long)__dest + rowPitchOrZero);
      }
    }
    return;
  }
  memcpy(destBuffer,srcBuffer,VVar2 * (long)depth);
  return;
}

Assistant:

void MemoryOp::pack (int				pixelSize,
					 int				width,
					 int				height,
					 int				depth,
					 vk::VkDeviceSize	rowPitchOrZero,
					 vk::VkDeviceSize	depthPitchOrZero,
					 const void *		srcBuffer,
					 void *				destBuffer)
{
	vk::VkDeviceSize rowPitch	= rowPitchOrZero;
	vk::VkDeviceSize depthPitch	= depthPitchOrZero;

	if (rowPitch == 0)
		rowPitch = width * pixelSize;

	if (depthPitch == 0)
		depthPitch = rowPitch * height;

	const vk::VkDeviceSize size = depthPitch * depth;

	const deUint8 *srcRow = reinterpret_cast<const deUint8 *>(srcBuffer);
	const deUint8 *srcStart;
	srcStart = srcRow;
	deUint8 *dstRow = reinterpret_cast<deUint8 *>(destBuffer);
	deUint8 *dstStart;
	dstStart = dstRow;

	if (rowPitch == static_cast<vk::VkDeviceSize>(width * pixelSize) &&
		depthPitch == static_cast<vk::VkDeviceSize>(rowPitch * height))
	{
		// fast path
		deMemcpy(dstRow, srcRow, static_cast<size_t>(size));
	}
	else
	{
		// slower, per row path
		for (int d = 0; d < depth; d++)
		{
			vk::VkDeviceSize offsetDepthDst = d * depthPitch;
			vk::VkDeviceSize offsetDepthSrc = d * (pixelSize * width * height);
			srcRow = srcStart + offsetDepthSrc;
			dstRow = dstStart + offsetDepthDst;
			for (int r = 0; r < height; ++r)
			{
				deMemcpy(dstRow, srcRow, static_cast<size_t>(rowPitch));
				srcRow += pixelSize * width;
				dstRow += rowPitch;
			}
		}
	}
}